

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int fmt::v6::internal::compare(bigint *lhs,bigint *rhs)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  char *in_RAX;
  int iVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  char *unaff_retaddr;
  
  uVar6 = (lhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar4 = (int)uVar6;
  iVar5 = lhs->exp_ + iVar4;
  uVar8 = (rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar9 = (int)uVar8;
  iVar7 = rhs->exp_ + iVar9;
  if (iVar5 == iVar7) {
    uVar6 = uVar6 & 0xffffffff;
    iVar4 = iVar4 - iVar9;
    iVar5 = 0;
    if (0 < iVar4) {
      iVar5 = iVar4;
    }
    uVar8 = uVar8 & 0xffffffff;
    do {
      if ((int)uVar6 <= iVar5) {
        if (uVar6 == uVar8) {
          return 0;
        }
        bVar3 = (int)uVar8 < (int)uVar6;
        goto LAB_0014532c;
      }
      if ((int)uVar8 < 1) {
        assert_fail(unaff_retaddr,0,in_RAX);
      }
      uVar2 = (lhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar6 - 1];
      uVar6 = uVar6 - 1;
      uVar1 = (rhs->bigits_).super_buffer<unsigned_int>.ptr_[uVar8 - 1];
      iVar4 = ((uVar1 < uVar2) - 1) + (uint)(uVar1 < uVar2);
      uVar8 = uVar8 - 1;
    } while (uVar2 == uVar1);
  }
  else {
    bVar3 = iVar7 < iVar5;
LAB_0014532c:
    iVar4 = (uint)bVar3 * 2 + -1;
  }
  return iVar4;
}

Assistant:

int compare(const bigint& lhs, const bigint& rhs) {
    int num_lhs_bigits = lhs.num_bigits(), num_rhs_bigits = rhs.num_bigits();
    if (num_lhs_bigits != num_rhs_bigits)
      return num_lhs_bigits > num_rhs_bigits ? 1 : -1;
    int i = static_cast<int>(lhs.bigits_.size()) - 1;
    int j = static_cast<int>(rhs.bigits_.size()) - 1;
    int end = i - j;
    if (end < 0) end = 0;
    for (; i >= end; --i, --j) {
      bigit lhs_bigit = lhs[i], rhs_bigit = rhs[j];
      if (lhs_bigit != rhs_bigit) return lhs_bigit > rhs_bigit ? 1 : -1;
    }
    if (i != j) return i > j ? 1 : -1;
    return 0;
  }